

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

bool __thiscall leveldb::DBImpl::GetProperty(DBImpl *this,Slice *property,string *value)

{
  long *__s1;
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  size_t sVar6;
  int64_t iVar7;
  CompactionStats *pCVar8;
  int level;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Slice in;
  uint64_t level_1;
  char buf [50];
  Slice local_118;
  ulong local_100;
  string local_f8 [6];
  
  value->_M_string_length = 0;
  *(value->_M_dataplus)._M_p = '\0';
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  local_118.data_ = property->data_;
  local_118.size_ = property->size_;
  if ((local_118.size_ < 8) || (*(long *)local_118.data_ != 0x2e62646c6576656c)) {
    bVar11 = false;
    goto LAB_0010e28e;
  }
  if (local_118.size_ < 8) {
    __assert_fail("n <= size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/include/leveldb/slice.h"
                  ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
  }
  __s1 = (long *)((long)local_118.data_ + 8);
  uVar10 = local_118.size_ - 8;
  if ((0x11 < uVar10) &&
     (auVar12[0] = -((char)*__s1 == 'n'),
     auVar12[1] = -(*(char *)((long)local_118.data_ + 9) == 'u'),
     auVar12[2] = -(*(char *)((long)local_118.data_ + 10) == 'm'),
     auVar12[3] = -(*(char *)((long)local_118.data_ + 0xb) == '-'),
     auVar12[4] = -(*(char *)((long)local_118.data_ + 0xc) == 'f'),
     auVar12[5] = -(*(char *)((long)local_118.data_ + 0xd) == 'i'),
     auVar12[6] = -(*(char *)((long)local_118.data_ + 0xe) == 'l'),
     auVar12[7] = -(*(char *)((long)local_118.data_ + 0xf) == 'e'),
     auVar12[8] = -((char)*(long *)((long)local_118.data_ + 0x10) == 's'),
     auVar12[9] = -(*(char *)((long)local_118.data_ + 0x11) == '-'),
     auVar12[10] = -(*(char *)((long)local_118.data_ + 0x12) == 'a'),
     auVar12[0xb] = -(*(char *)((long)local_118.data_ + 0x13) == 't'),
     auVar12[0xc] = -(*(char *)((long)local_118.data_ + 0x14) == '-'),
     auVar12[0xd] = -(*(char *)((long)local_118.data_ + 0x15) == 'l'),
     auVar12[0xe] = -(*(char *)((long)local_118.data_ + 0x16) == 'e'),
     auVar12[0xf] = -(*(char *)((long)local_118.data_ + 0x17) == 'v'),
     auVar13[0] = -((char)(short)*(long *)((long)local_118.data_ + 0x18) == 'e'),
     auVar13[1] = -((char)((ushort)(short)*(long *)((long)local_118.data_ + 0x18) >> 8) == 'l'),
     auVar13[2] = 0xff, auVar13[3] = 0xff, auVar13[4] = 0xff, auVar13[5] = 0xff, auVar13[6] = 0xff,
     auVar13[7] = 0xff, auVar13[8] = 0xff, auVar13[9] = 0xff, auVar13[10] = 0xff,
     auVar13[0xb] = 0xff, auVar13[0xc] = 0xff, auVar13[0xd] = 0xff, auVar13[0xe] = 0xff,
     auVar13[0xf] = 0xff, auVar13 = auVar13 & auVar12,
     (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff)) {
    local_118.data_ = (char *)((long)local_118.data_ + 0x1a);
    local_118.size_ = local_118.size_ - 0x1a;
    bVar3 = ConsumeDecimalNumber(&local_118,&local_100);
    bVar11 = local_100 < 7 && (bVar3 && local_118.size_ == 0);
    if (local_100 < 7 && (bVar3 && local_118.size_ == 0)) {
      uVar5 = VersionSet::NumLevelFiles(this->versions_,(int)local_100);
      snprintf((char *)local_f8,100,"%d",(ulong)uVar5);
      pcVar1 = (char *)value->_M_string_length;
      strlen((char *)local_f8);
      std::__cxx11::string::_M_replace((ulong)value,0,pcVar1,(ulong)local_f8);
    }
    goto LAB_0010e28e;
  }
  local_118.data_ = (char *)__s1;
  uVar2 = uVar10;
  if (local_118.size_ == 0x20) {
LAB_0010e35e:
    local_118.size_ = uVar2;
    iVar4 = bcmp(__s1,"approximate-memory-usage",uVar10);
    if (iVar4 == 0) {
      iVar4 = (*((this->options_).block_cache)->_vptr_Cache[9])();
      lVar9 = CONCAT44(extraout_var,iVar4);
      if (this->mem_ != (MemTable *)0x0) {
        sVar6 = MemTable::ApproximateMemoryUsage(this->mem_);
        lVar9 = lVar9 + sVar6;
      }
      if (this->imm_ != (MemTable *)0x0) {
        sVar6 = MemTable::ApproximateMemoryUsage(this->imm_);
        lVar9 = lVar9 + sVar6;
      }
      snprintf((char *)local_f8,0x32,"%llu",lVar9);
      std::__cxx11::string::append((char *)value);
LAB_0010e4b9:
      bVar11 = true;
      goto LAB_0010e28e;
    }
  }
  else if (local_118.size_ == 0x10) {
    local_118.size_ = uVar10;
    iVar4 = bcmp(__s1,"sstables",uVar10);
    if (iVar4 == 0) {
      Version::DebugString_abi_cxx11_(local_f8,this->versions_->current_);
      std::__cxx11::string::operator=((string *)value,(string *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
        operator_delete(local_f8[0]._M_dataplus._M_p);
      }
      goto LAB_0010e4b9;
    }
    uVar2 = local_118.size_;
    if (uVar10 == 0x18) goto LAB_0010e35e;
  }
  else {
    bVar11 = local_118.size_ == 0xd;
    local_118.size_ = uVar10;
    if ((bVar11) && (iVar4 = bcmp(__s1,"stats",uVar10), iVar4 == 0)) {
      memcpy(local_f8,
             "                               Compactions\nLevel  Files Size(MB) Time(sec) Read(MB) Write(MB)\n--------------------------------------------------\n"
             ,0x92);
      std::__cxx11::string::append((char *)value);
      pCVar8 = this->stats_;
      uVar10 = 0;
      do {
        uVar5 = VersionSet::NumLevelFiles(this->versions_,(int)uVar10);
        if ((0 < (int)uVar5) || (0 < pCVar8->micros)) {
          iVar7 = VersionSet::NumLevelBytes(this->versions_,(int)uVar10);
          snprintf((char *)local_f8,200,"%3d %8d %8.0f %9.0f %8.0f %9.0f\n",
                   (double)iVar7 * 9.5367431640625e-07,(double)pCVar8->micros / 1000000.0,
                   (double)pCVar8->bytes_read * 9.5367431640625e-07,
                   (double)pCVar8->bytes_written * 9.5367431640625e-07,uVar10 & 0xffffffff,
                   (ulong)uVar5);
          std::__cxx11::string::append((char *)value);
        }
        uVar10 = uVar10 + 1;
        pCVar8 = pCVar8 + 1;
      } while (uVar10 != 7);
      bVar11 = true;
      goto LAB_0010e28e;
    }
  }
  bVar11 = false;
LAB_0010e28e:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return bVar11;
}

Assistant:

bool DBImpl::GetProperty(const Slice& property, std::string* value) {
  value->clear();

  MutexLock l(&mutex_);
  Slice in = property;
  Slice prefix("leveldb.");
  if (!in.starts_with(prefix)) return false;
  in.remove_prefix(prefix.size());

  if (in.starts_with("num-files-at-level")) {
    in.remove_prefix(strlen("num-files-at-level"));
    uint64_t level;
    bool ok = ConsumeDecimalNumber(&in, &level) && in.empty();
    if (!ok || level >= config::kNumLevels) {
      return false;
    } else {
      char buf[100];
      snprintf(buf, sizeof(buf), "%d",
               versions_->NumLevelFiles(static_cast<int>(level)));
      *value = buf;
      return true;
    }
  } else if (in == "stats") {
    char buf[200];
    snprintf(buf, sizeof(buf),
             "                               Compactions\n"
             "Level  Files Size(MB) Time(sec) Read(MB) Write(MB)\n"
             "--------------------------------------------------\n");
    value->append(buf);
    for (int level = 0; level < config::kNumLevels; level++) {
      int files = versions_->NumLevelFiles(level);
      if (stats_[level].micros > 0 || files > 0) {
        snprintf(buf, sizeof(buf), "%3d %8d %8.0f %9.0f %8.0f %9.0f\n", level,
                 files, versions_->NumLevelBytes(level) / 1048576.0,
                 stats_[level].micros / 1e6,
                 stats_[level].bytes_read / 1048576.0,
                 stats_[level].bytes_written / 1048576.0);
        value->append(buf);
      }
    }
    return true;
  } else if (in == "sstables") {
    *value = versions_->current()->DebugString();
    return true;
  } else if (in == "approximate-memory-usage") {
    size_t total_usage = options_.block_cache->TotalCharge();
    if (mem_) {
      total_usage += mem_->ApproximateMemoryUsage();
    }
    if (imm_) {
      total_usage += imm_->ApproximateMemoryUsage();
    }
    char buf[50];
    snprintf(buf, sizeof(buf), "%llu",
             static_cast<unsigned long long>(total_usage));
    value->append(buf);
    return true;
  }

  return false;
}